

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O0

App * __thiscall CLI::App::ignore_underscore(App *this,bool value)

{
  ulong uVar1;
  OptionAlreadyAdded *this_00;
  App *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *match;
  App *p;
  App *pAStack_10;
  bool value_local;
  App *this_local;
  
  p._7_1_ = value;
  if ((value) && ((this->ignore_underscore_ & 1U) == 0)) {
    this->ignore_underscore_ = true;
    local_68 = this;
    pAStack_10 = this;
    if (this->parent_ != (App *)0x0) {
      local_68 = _get_fallthrough_parent(this);
    }
    match = (string *)local_68;
    local_28 = _compare_subcommand_names_abi_cxx11_(this,this,local_68);
    uVar1 = ::std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      this->ignore_underscore_ = false;
      this_00 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
      ::std::operator+(&local_48,"ignore underscore would cause subcommand name conflicts: ",
                       local_28);
      OptionAlreadyAdded::OptionAlreadyAdded(this_00,&local_48);
      __cxa_throw(this_00,&OptionAlreadyAdded::typeinfo,OptionAlreadyAdded::~OptionAlreadyAdded);
    }
  }
  this->ignore_underscore_ = (bool)(p._7_1_ & 1);
  return this;
}

Assistant:

CLI11_INLINE App *App::ignore_underscore(bool value) {
    if(value && !ignore_underscore_) {
        ignore_underscore_ = true;
        auto *p = (parent_ != nullptr) ? _get_fallthrough_parent() : this;
        const auto &match = _compare_subcommand_names(*this, *p);
        if(!match.empty()) {
            ignore_underscore_ = false;
            throw OptionAlreadyAdded("ignore underscore would cause subcommand name conflicts: " + match);
        }
    }
    ignore_underscore_ = value;
    return this;
}